

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

ExtensionInfo *
google::protobuf::internal::anon_unknown_58::FindRegisteredExtension
          (MessageLite *extendee,int number)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 uVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [16];
  iterator *this;
  ushort uVar13;
  ulong uVar14;
  uint uVar15;
  ExtensionInfo *b;
  ExtensionInfo *pEVar16;
  __m128i match;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  char cVar19;
  char cVar21;
  char cVar22;
  char cVar23;
  
  if ((anonymous_namespace)::global_registry == (ulong *)0x0) {
    pEVar16 = (ExtensionInfo *)0x0;
  }
  else {
    uVar2 = *(anonymous_namespace)::global_registry;
    if (uVar2 < 0x11 && 1 < (anonymous_namespace)::global_registry[1]) {
      if (0xe < uVar2) {
        pauVar12 = (undefined1 (*) [16])(anonymous_namespace)::global_registry[2];
        uVar9 = (anonymous_namespace)::global_registry[1] >> 1;
        do {
          auVar17 = *pauVar12;
          uVar15 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(byte)(auVar17[0xf] >> 7) << 0xf);
          if (uVar15 != 0xffff) {
            uVar15 = ~uVar15;
            do {
              uVar3 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                }
              }
              if ((char)(*pauVar12)[uVar3] < '\0') {
                __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x764,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                             );
              }
              uVar9 = uVar9 - 1;
              uVar13 = (ushort)(uVar15 - 1) & (ushort)uVar15;
              uVar15 = CONCAT22((short)(uVar15 - 1 >> 0x10),uVar13);
            } while (uVar13 != 0);
            if (uVar9 == 0) goto LAB_00256d77;
          }
          pauVar12 = pauVar12 + 1;
          if (auVar17[0xf] == 0xff) {
            __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x76b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
        } while( true );
      }
      if (8 < uVar2) {
        __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x753,
                      "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                     );
      }
    }
LAB_00256d77:
    uVar9 = (anonymous_namespace)::global_registry[2];
    if ((uVar2 + 1 & uVar2) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x145,
                    "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                   );
    }
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed + (long)extendee;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)&extendee->_vptr_MessageLite +
                   (SUB168(auVar17 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar17 * ZEXT816(0x9ddfea08eb382d69),8));
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),8)) + (ulong)(uint)number;
    uVar11 = SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0);
    uVar8 = uVar11 >> 7 ^ uVar9 >> 0xc;
    uVar10 = (undefined1)uVar11;
    auVar17 = ZEXT216(CONCAT11(uVar10,uVar10) & 0x7f7f);
    auVar17 = pshuflw(auVar17,auVar17,0);
    b = (ExtensionInfo *)(anonymous_namespace)::global_registry[3];
    uVar11 = 0;
    while( true ) {
      uVar8 = uVar8 & uVar2;
      pcVar1 = (char *)(uVar9 + uVar8);
      cVar6 = pcVar1[0xf];
      cVar19 = auVar17[0];
      auVar20[0] = -(cVar19 == *pcVar1);
      cVar21 = auVar17[1];
      auVar20[1] = -(cVar21 == pcVar1[1]);
      cVar22 = auVar17[2];
      auVar20[2] = -(cVar22 == pcVar1[2]);
      cVar23 = auVar17[3];
      auVar20[3] = -(cVar23 == pcVar1[3]);
      auVar20[4] = -(cVar19 == pcVar1[4]);
      auVar20[5] = -(cVar21 == pcVar1[5]);
      auVar20[6] = -(cVar22 == pcVar1[6]);
      auVar20[7] = -(cVar23 == pcVar1[7]);
      auVar20[8] = -(cVar19 == pcVar1[8]);
      auVar20[9] = -(cVar21 == pcVar1[9]);
      auVar20[10] = -(cVar22 == pcVar1[10]);
      auVar20[0xb] = -(cVar23 == pcVar1[0xb]);
      auVar20[0xc] = -(cVar19 == pcVar1[0xc]);
      auVar20[0xd] = -(cVar21 == pcVar1[0xd]);
      auVar20[0xe] = -(cVar22 == pcVar1[0xe]);
      auVar20[0xf] = -(cVar23 == cVar6);
      uVar13 = (ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe | (ushort)(auVar20[0xf] >> 7) << 0xf;
      uVar15 = (uint)uVar13;
      while (uVar13 != 0) {
        uVar3 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        uVar14 = uVar3 + uVar8 & uVar2;
        if ((b[uVar14].message == extendee) && (b[uVar14].number == number)) {
          if (uVar9 == 0) {
            __assert_fail("ctrl != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x9c4,
                          "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>]"
                         );
          }
          b = b + uVar14;
          this = (iterator *)(uVar9 + uVar14);
          goto LAB_00256e8b;
        }
        uVar13 = (ushort)(uVar15 - 1) & (ushort)uVar15;
        uVar15 = CONCAT22((short)(uVar15 - 1 >> 0x10),uVar13);
      }
      auVar18[0] = -(*pcVar1 == -0x80);
      auVar18[1] = -(pcVar1[1] == -0x80);
      auVar18[2] = -(pcVar1[2] == -0x80);
      auVar18[3] = -(pcVar1[3] == -0x80);
      auVar18[4] = -(pcVar1[4] == -0x80);
      auVar18[5] = -(pcVar1[5] == -0x80);
      auVar18[6] = -(pcVar1[6] == -0x80);
      auVar18[7] = -(pcVar1[7] == -0x80);
      auVar18[8] = -(pcVar1[8] == -0x80);
      auVar18[9] = -(pcVar1[9] == -0x80);
      auVar18[10] = -(pcVar1[10] == -0x80);
      auVar18[0xb] = -(pcVar1[0xb] == -0x80);
      auVar18[0xc] = -(pcVar1[0xc] == -0x80);
      auVar18[0xd] = -(pcVar1[0xd] == -0x80);
      auVar18[0xe] = -(pcVar1[0xe] == -0x80);
      auVar18[0xf] = -(cVar6 == -0x80);
      if ((((((((((((((((auVar18 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar18 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar18 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar18 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar18 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar18 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar18 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar18 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar18 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar18 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar18 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar18 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar18 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar6 == -0x80)
      break;
      uVar8 = uVar8 + uVar11 + 0x10;
      uVar11 = uVar11 + 0x10;
      if (uVar2 < uVar11) {
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xdbd,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::(anonymous namespace)::ExtensionInfoKey]"
                     );
      }
    }
    this = (iterator *)0x0;
LAB_00256e8b:
    bVar7 = absl::lts_20240722::container_internal::operator==
                      ((const_iterator *)this,(const_iterator *)b);
    pEVar16 = (ExtensionInfo *)0x0;
    if (!bVar7) {
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
      ::iterator::operator*(this);
      pEVar16 = b;
    }
  }
  return pEVar16;
}

Assistant:

const ExtensionInfo* FindRegisteredExtension(const MessageLite* extendee,
                                             int number) {
  if (!global_registry) return nullptr;

  ExtensionInfoKey info;
  info.message = extendee;
  info.number = number;

  auto it = global_registry->find(info);
  if (it == global_registry->end()) {
    return nullptr;
  } else {
    return &*it;
  }
}